

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O0

void __thiscall UnifiedRegex::RegexPattern::Print(RegexPattern *this,DebugWriter *w)

{
  Char c_00;
  code *pcVar1;
  Type this_00;
  bool bVar2;
  charcount_t cVar3;
  uint uVar4;
  char16 *pcVar5;
  undefined4 *puVar6;
  char16_t *local_60;
  uint local_2c;
  undefined1 local_28 [2];
  char16 c;
  charcount_t i;
  InternalString str;
  DebugWriter *w_local;
  RegexPattern *this_local;
  
  str.m_content.ptr = w->buf;
  DebugWriter::Print(w,L"/");
  GetSource((RegexPattern *)local_28);
  cVar3 = Js::InternalString::GetLength((InternalString *)local_28);
  if (cVar3 == 0) {
    DebugWriter::Print((DebugWriter *)str.m_content.ptr,L"(?:)");
  }
  else {
    for (local_2c = 0; cVar3 = Js::InternalString::GetLength((InternalString *)local_28),
        local_2c < cVar3; local_2c = local_2c + 1) {
      pcVar5 = Js::InternalString::GetBuffer((InternalString *)local_28);
      c_00 = pcVar5[local_2c];
      uVar4 = (uint)(ushort)c_00;
      if ((uVar4 == 10) || (uVar4 == 0xd)) {
LAB_015bc676:
        DebugWriter::PrintEscapedChar((DebugWriter *)str.m_content.ptr,c_00);
      }
      else if (uVar4 == 0x2d) {
        DebugWriter::Print((DebugWriter *)str.m_content.ptr,L"-");
      }
      else if (uVar4 == 0x2f) {
        DebugWriter::Print((DebugWriter *)str.m_content.ptr,L"\\%lc",(ulong)(ushort)c_00);
      }
      else if (uVar4 == 0x5c) {
        cVar3 = Js::InternalString::GetLength((InternalString *)local_28);
        if (cVar3 <= local_2c + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
                             ,0xbe,"(i + 1 < str.GetLength())","i + 1 < str.GetLength()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        this_00.ptr = str.m_content.ptr;
        pcVar5 = Js::InternalString::GetBuffer((InternalString *)local_28);
        local_2c = local_2c + 1;
        DebugWriter::Print((DebugWriter *)this_00.ptr,L"\\%lc",(ulong)(ushort)pcVar5[local_2c]);
      }
      else {
        if (uVar4 - 0x2028 < 2) goto LAB_015bc676;
        DebugWriter::PrintEscapedChar((DebugWriter *)str.m_content.ptr,c_00);
      }
    }
  }
  DebugWriter::Print((DebugWriter *)str.m_content.ptr,L"/");
  bVar2 = IsIgnoreCase(this);
  if (bVar2) {
    DebugWriter::Print((DebugWriter *)str.m_content.ptr,L"i");
  }
  bVar2 = IsGlobal(this);
  if (bVar2) {
    DebugWriter::Print((DebugWriter *)str.m_content.ptr,L"g");
  }
  bVar2 = IsMultiline(this);
  if (bVar2) {
    DebugWriter::Print((DebugWriter *)str.m_content.ptr,L"m");
  }
  bVar2 = IsDotAll(this);
  if (bVar2) {
    DebugWriter::Print((DebugWriter *)str.m_content.ptr,L"s");
  }
  bVar2 = IsUnicode(this);
  if (bVar2) {
    DebugWriter::Print((DebugWriter *)str.m_content.ptr,L"u");
  }
  bVar2 = IsSticky(this);
  if (bVar2) {
    DebugWriter::Print((DebugWriter *)str.m_content.ptr,L"y");
  }
  DebugWriter::Print((DebugWriter *)str.m_content.ptr,L" /* ");
  DebugWriter::Print((DebugWriter *)str.m_content.ptr,L", ");
  if ((this->field_0x18 & 1) == 0) {
    local_60 = L"dynamic";
  }
  else {
    local_60 = L"literal";
  }
  DebugWriter::Print((DebugWriter *)str.m_content.ptr,local_60);
  DebugWriter::Print((DebugWriter *)str.m_content.ptr,L" */");
  return;
}

Assistant:

void RegexPattern::Print(DebugWriter* w)
    {
        w->Print(_u("/"));

        Js::InternalString str = GetSource();
        if (str.GetLength() == 0)
            w->Print(_u("(?:)"));
        else
        {
            for (charcount_t i = 0; i < str.GetLength(); ++i)
            {
                const char16 c = str.GetBuffer()[i];
                switch(c)
                {
                case _u('/'):
                    w->Print(_u("\\%lc"), c);
                    break;
                case _u('\n'):
                case _u('\r'):
                case _u('\x2028'):
                case _u('\x2029'):
                    w->PrintEscapedChar(c);
                    break;
                case _u('-'):
                    w->Print(_u("-"));
                    break;
                case _u('\\'):
                    Assert(i + 1 < str.GetLength()); // cannot end in a '\'
                    w->Print(_u("\\%lc"), str.GetBuffer()[++i]);
                    break;
                default:
                    w->PrintEscapedChar(c);
                    break;
                }
            }
        }
        w->Print(_u("/"));
        if (IsIgnoreCase())
            w->Print(_u("i"));
        if (IsGlobal())
            w->Print(_u("g"));
        if (IsMultiline())
            w->Print(_u("m"));
        if (IsDotAll())
            w->Print(_u("s"));
        if (IsUnicode())
            w->Print(_u("u"));
        if (IsSticky())
            w->Print(_u("y"));
        w->Print(_u(" /* "));
        w->Print(_u(", "));
        w->Print(isLiteral ? _u("literal") : _u("dynamic"));
        w->Print(_u(" */"));
    }